

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGenerators::ListQt4RccInputs
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmSourceFile *sf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  string *psVar4;
  cmSourceFileLocation *pcVar5;
  long *plVar6;
  long *plVar7;
  char *pcVar8;
  long lVar9;
  string qrcEntry;
  string tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string qrcContents;
  RegularExpression fileReplaceRegex;
  RegularExpression fileMatchRegex;
  value_type local_288;
  undefined1 *local_268;
  undefined8 local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long *local_228 [2];
  long local_218 [2];
  cmSourceFile *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_200;
  char *local_1f8;
  string local_1f0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  
  local_208 = sf;
  local_200 = depends;
  psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
  ReadAll(&local_1f0,(string *)(psVar4->_M_dataplus)._M_p);
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"(<file[^<]+)");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar8 = "";
  lVar9 = 0;
  while (bVar3 = cmsys::RegularExpression::find(&local_100,local_1f0._M_dataplus._M_p + lVar9),
        bVar3) {
    local_1f8 = pcVar8;
    if (local_100.startp[1] == (char *)0x0) {
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      local_288._M_string_length = 0;
      local_288.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,local_100.startp[1],local_100.endp[1]);
    }
    sVar2 = local_288._M_string_length;
    local_1d0.program = (char *)0x0;
    cmsys::RegularExpression::compile(&local_1d0,"(^<file[^>]*>)");
    cmsys::RegularExpression::find(&local_1d0,local_288._M_dataplus._M_p);
    if (local_1d0.startp[1] == (char *)0x0) {
      local_268 = &local_258;
      local_260 = 0;
      local_258 = 0;
    }
    else {
      local_268 = &local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_268,local_1d0.startp[1],local_1d0.endp[1]);
    }
    std::__cxx11::string::substr((ulong)&local_248,(ulong)&local_288);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_248);
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    bVar3 = cmsys::SystemTools::FileIsFullPath(local_288._M_dataplus._M_p);
    if (!bVar3) {
      pcVar5 = cmSourceFile::GetLocation(local_208);
      local_228[0] = local_218;
      pcVar1 = (pcVar5->Directory)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,pcVar1,pcVar1 + (pcVar5->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_228);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_228,(ulong)local_288._M_dataplus._M_p);
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        local_238 = *plVar7;
        lStack_230 = plVar6[3];
        local_248 = &local_238;
      }
      else {
        local_238 = *plVar7;
        local_248 = (long *)*plVar6;
      }
      local_240 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_288,(string *)&local_248);
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_228[0] != local_218) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_288._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_200,&local_288);
    if (local_268 != &local_258) {
      operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
    }
    if (local_1d0.program != (char *)0x0) {
      operator_delete__(local_1d0.program);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    lVar9 = lVar9 + sVar2;
    pcVar8 = "@list_sep@";
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ListQt4RccInputs(cmSourceFile* sf,
                                            std::vector<std::string>& depends)
{
  const std::string qrcContents = ReadAll(sf->GetFullPath());

  cmsys::RegularExpression fileMatchRegex("(<file[^<]+)");

  std::string entriesList;
  const char* sep = "";

  size_t offset = 0;
  while (fileMatchRegex.find(qrcContents.c_str() + offset))
    {
    std::string qrcEntry = fileMatchRegex.match(1);

    offset += qrcEntry.size();

    cmsys::RegularExpression fileReplaceRegex("(^<file[^>]*>)");
    fileReplaceRegex.find(qrcEntry);
    std::string tag = fileReplaceRegex.match(1);

    qrcEntry = qrcEntry.substr(tag.size());

    if (!cmSystemTools::FileIsFullPath(qrcEntry.c_str()))
      {
      qrcEntry = sf->GetLocation().GetDirectory() + "/" + qrcEntry;
      }

    entriesList += sep;
    entriesList += qrcEntry;
    sep = "@list_sep@";
    depends.push_back(qrcEntry);
    }
  return entriesList;
}